

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_structs.h
# Opt level: O0

void internal_exr_lock(_internal_exr_context *c)

{
  _internal_exr_context *c_local;
  
  return;
}

Assistant:

static inline void
internal_exr_lock (const struct _internal_exr_context* c)
{
#ifdef ILMTHREAD_THREADING_ENABLED
    struct _internal_exr_context* nonc =
        EXR_CONST_CAST (struct _internal_exr_context*, c);
#    ifdef _WIN32
    EnterCriticalSection (&nonc->mutex);
#    else
    pthread_mutex_lock (&nonc->mutex);
#    endif
#endif
}